

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O1

pair<tsl::detail_robin_hash::robin_hash<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
 __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<std::__cxx11::wstring,unsigned_int>,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
::insert_impl<std::__cxx11::wstring,std::pair<std::__cxx11::wstring,unsigned_int>>
          (robin_hash<std::pair<std::__cxx11::wstring,unsigned_int>,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
           *this,basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *key,
          pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>
          *value_type_args)

{
  pointer pwVar1;
  size_type sVar2;
  wchar_t *__s2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  robin_hash<std::pair<std::__cxx11::wstring,unsigned_int>,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
  rVar7;
  value_type *in_RCX;
  size_t extraout_RDX;
  size_t __n;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  long lVar8;
  short dist_from_ideal_bucket;
  size_t ibucket;
  truncated_hash_type *ptVar9;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar10;
  
  sVar6 = std::
          hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          ::operator()((hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                        *)key,&value_type_args->first);
  pwVar1 = (key->_M_dataplus)._M_p;
  sVar2 = key->_M_string_length;
  ibucket = sVar6 & (ulong)pwVar1;
  lVar8 = ibucket * 0x30;
  if (*(short *)(sVar2 + 4 + lVar8) < 0) {
    dist_from_ideal_bucket = 0;
  }
  else {
    __s2 = (value_type_args->first)._M_dataplus._M_p;
    sVar3 = (value_type_args->first)._M_string_length;
    dist_from_ideal_bucket = 0;
    do {
      lVar8 = lVar8 + sVar2;
      __n = *(size_t *)(lVar8 + 0x10);
      if ((__n == sVar3) &&
         ((__n == 0 ||
          (iVar5 = wmemcmp(*(wchar_t **)(lVar8 + 8),__s2,__n), __n = extraout_RDX, iVar5 == 0)))) {
        rVar7 = (robin_hash<std::pair<std::__cxx11::wstring,unsigned_int>,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                 )0x0;
        goto LAB_0010c2fe;
      }
      dist_from_ideal_bucket = dist_from_ideal_bucket + 1;
      ibucket = ibucket + 1 & (ulong)pwVar1;
      lVar8 = ibucket * 0x30;
    } while (dist_from_ideal_bucket <= *(short *)(sVar2 + 4 + lVar8));
  }
  bVar4 = robin_hash<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
          ::grow_on_high_load((robin_hash<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                               *)key);
  if (bVar4) {
    pwVar1 = (key->_M_dataplus)._M_p;
    ibucket = sVar6 & (ulong)pwVar1;
    if (*(short *)(key->_M_string_length + 4 + ibucket * 0x30) < 0) {
      dist_from_ideal_bucket = 0;
    }
    else {
      dist_from_ideal_bucket = 0;
      do {
        dist_from_ideal_bucket = dist_from_ideal_bucket + 1;
        ibucket = ibucket + 1 & (ulong)pwVar1;
      } while (dist_from_ideal_bucket <= *(short *)(key->_M_string_length + 4 + ibucket * 0x30));
    }
  }
  lVar8 = ibucket * 0x30;
  if (*(short *)(key->_M_string_length + 4 + lVar8) == -1) {
    ptVar9 = (truncated_hash_type *)(key->_M_string_length + lVar8);
    std::__cxx11::wstring::wstring((wstring *)(ptVar9 + 2),(wstring *)in_RCX);
    ptVar9[10] = in_RCX->second;
    *ptVar9 = (truncated_hash_type)sVar6;
    *(short *)(ptVar9 + 1) = dist_from_ideal_bucket;
    __n = extraout_RDX_01;
  }
  else {
    robin_hash<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
    ::insert_value((robin_hash<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                    *)key,ibucket,dist_from_ideal_bucket,(truncated_hash_type)sVar6,in_RCX);
    __n = extraout_RDX_00;
  }
  key[1]._M_string_length = key[1]._M_string_length + 1;
  lVar8 = lVar8 + key->_M_string_length;
  rVar7 = (robin_hash<std::pair<std::__cxx11::wstring,unsigned_int>,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
           )0x1;
LAB_0010c2fe:
  *(long *)this = lVar8;
  this[8] = rVar7;
  pVar10._8_8_ = __n;
  pVar10.first.m_iterator._M_current = (iterator_bucket)(iterator_bucket)this;
  return pVar10;
}

Assistant:

std::pair<iterator, bool> insert_impl(const K& key, Args&&... value_type_args) {
        const std::size_t hash = hash_key(key);
        
        std::size_t ibucket = bucket_for_hash(hash); 
        distance_type dist_from_ideal_bucket = 0;
        
        while(dist_from_ideal_bucket <= m_buckets[ibucket].dist_from_ideal_bucket()) {
            if((!USE_STORED_HASH_ON_LOOKUP || m_buckets[ibucket].bucket_hash_equal(hash)) &&
               compare_keys(KeySelect()(m_buckets[ibucket].value()), key)) 
            {
                return std::make_pair(iterator(m_buckets.begin() + ibucket), false);
            }
            
            ibucket = next_bucket(ibucket);
            dist_from_ideal_bucket++;
        }
        
        if(grow_on_high_load()) {
            ibucket = bucket_for_hash(hash);
            dist_from_ideal_bucket = 0;
            
            while(dist_from_ideal_bucket <= m_buckets[ibucket].dist_from_ideal_bucket()) {
                ibucket = next_bucket(ibucket);
                dist_from_ideal_bucket++;
            }
        }
 
        
        if(m_buckets[ibucket].empty()) {
            m_buckets[ibucket].set_value_of_empty_bucket(dist_from_ideal_bucket, bucket_entry::truncate_hash(hash),
                                                         std::forward<Args>(value_type_args)...);
        }
        else {
            insert_value(ibucket, dist_from_ideal_bucket, bucket_entry::truncate_hash(hash), 
                         std::forward<Args>(value_type_args)...);
        }
        
        
        m_nb_elements++;
        /*
         * The value will be inserted in ibucket in any case, either because it was
         * empty or by stealing the bucket (robin hood). 
         */
        return std::make_pair(iterator(m_buckets.begin() + ibucket), true);
    }